

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void __thiscall capnp::_::ReaderArena::ReaderArena(ReaderArena *this,MessageReader *message)

{
  int iVar1;
  undefined4 extraout_var;
  ulong extraout_RDX;
  anon_class_8_1_89918cff local_20;
  size_t local_18;
  
  iVar1 = (*message->_vptr_MessageReader[2])(message,0);
  local_20.size = &local_18;
  if (extraout_RDX < 0x20000000) {
    (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__ReaderArena_002cfd48;
    this->message = message;
    (this->readLimiter).limit = (message->options).traversalLimitInWords;
    (this->segment0).arena = &this->super_Arena;
    (this->segment0).id.value = 0;
    (this->segment0).ptr.ptr = (word *)CONCAT44(extraout_var,iVar1);
    (this->segment0).ptr.size_ = extraout_RDX;
    (this->segment0).readLimiter = &this->readLimiter;
    kj::_::Mutex::Mutex(&(this->moreSegments).mutex);
    (this->moreSegments).value.ptr.isSet = false;
    return;
  }
  verifySegmentSize::anon_class_8_1_89918cff::operator()(&local_20);
}

Assistant:

ReaderArena::ReaderArena(MessageReader* message)
    : ReaderArena(message, message->getSegment(0)) {}